

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid)

{
  REF_INT RVar1;
  REF_NODE pRVar2;
  REF_INT *pRVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  REF_EDGE ref_edge_00;
  int iVar17;
  long lVar18;
  REF_CELL pRVar19;
  bool bVar20;
  double dVar21;
  REF_INT ntri;
  REF_DBL e1 [3];
  REF_EDGE ref_edge;
  REF_INT tri_list [2];
  REF_DBL e0 [3];
  uint local_118;
  int local_114;
  REF_CELL local_110;
  REF_DBL *local_108;
  REF_NODE local_100;
  undefined8 local_f8;
  double local_f0;
  double local_e8;
  REF_EDGE local_d8;
  int local_d0;
  int local_cc;
  REF_INT *local_c8;
  long local_c0;
  long local_b8;
  REF_GRID local_b0;
  undefined8 local_a8;
  REF_INT local_a0;
  int iStack_9c;
  REF_INT local_98;
  undefined4 uStack_94;
  
  pRVar2 = ref_grid->node;
  pRVar19 = ref_grid->cell[3];
  uVar4 = ref_edge_create(&local_d8,ref_grid);
  if (uVar4 != 0) {
    pcVar16 = "orig edges";
    uVar9 = 0x167;
    goto LAB_0021d503;
  }
  iVar13 = local_d8->n;
  lVar18 = (long)iVar13;
  local_110 = pRVar19;
  local_100 = pRVar2;
  if (lVar18 < 0) {
    local_118 = 1;
    pcVar16 = "malloc dots of REF_DBL negative";
LAB_0021d586:
    pRVar19 = local_110;
    bVar20 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x168,
           "ref_layer_quad_right_triangles",pcVar16);
    pRVar5 = (REF_DBL *)0x0;
  }
  else {
    pRVar5 = (REF_DBL *)malloc(lVar18 * 8);
    if (pRVar5 == (REF_DBL *)0x0) {
      local_118 = 2;
      pcVar16 = "malloc dots of REF_DBL NULL";
      goto LAB_0021d586;
    }
    bVar20 = true;
    local_118 = 0;
    pRVar19 = local_110;
    if (iVar13 != 0) {
      lVar6 = 0;
      do {
        pRVar5[lVar6] = 2.0;
        lVar6 = lVar6 + 1;
      } while (lVar18 != lVar6);
    }
  }
  if (!bVar20) {
    return local_118;
  }
  if ((long)local_d8->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x169,
           "ref_layer_quad_right_triangles","malloc order of REF_INT negative");
    return 1;
  }
  local_c8 = (REF_INT *)malloc((long)local_d8->n << 2);
  if (local_c8 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x169,
           "ref_layer_quad_right_triangles","malloc order of REF_INT NULL");
    return 2;
  }
  iVar13 = local_d8->n;
  local_108 = pRVar5;
  local_b0 = ref_grid;
  if (0 < iVar13) {
    lVar18 = 0;
    do {
      RVar1 = local_d8->e2n[lVar18 * 2];
      iVar13 = local_d8->e2n[lVar18 * 2 + 1];
      uVar4 = ref_cell_list_with2(pRVar19,RVar1,iVar13,2,&local_114,&local_d0);
      if (uVar4 == 0) {
        bVar20 = true;
        if (local_114 == 2) {
          lVar6 = (long)pRVar19->node_per;
          if (lVar6 < 1) {
            iVar17 = -1;
          }
          else {
            iVar17 = -1;
            lVar10 = 0;
            do {
              iVar12 = pRVar19->c2n[(long)pRVar19->size_per * (long)local_d0 + lVar10];
              iVar8 = iVar12;
              if (iVar12 == iVar13) {
                iVar8 = iVar17;
              }
              if (iVar12 != RVar1) {
                iVar17 = iVar8;
              }
              lVar10 = lVar10 + 1;
            } while (lVar6 != lVar10);
          }
          if (iVar17 == -1) {
            uVar9 = 0x17c;
            pcVar16 = "n2 not found";
          }
          else {
            if (pRVar19->node_per < 1) {
              iVar12 = -1;
            }
            else {
              iVar12 = -1;
              lVar10 = 0;
              do {
                iVar8 = local_110->c2n[(long)local_110->size_per * (long)local_cc + lVar10];
                iVar15 = iVar8;
                if (iVar8 == iVar13) {
                  iVar15 = iVar12;
                }
                if (iVar8 != RVar1) {
                  iVar12 = iVar15;
                }
                lVar10 = lVar10 + 1;
              } while (lVar6 != lVar10);
            }
            if (iVar12 != -1) {
              pRVar5 = local_100->real;
              local_b8 = (long)RVar1 * 0x78;
              lVar6 = 0;
              do {
                (&local_a8)[lVar6] =
                     pRVar5[(long)RVar1 * 0xf + lVar6] - pRVar5[iVar17 * 0xf + lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              pRVar5 = local_100->real;
              local_c0 = (long)iVar13 * 0x78;
              lVar6 = 0;
              do {
                (&local_f8)[lVar6] =
                     pRVar5[(long)iVar13 * 0xf + lVar6] - pRVar5[iVar17 * 0xf + lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              uVar4 = ref_math_normalize((REF_DBL *)&local_a8);
              if (uVar4 == 0) {
                uVar4 = ref_math_normalize((REF_DBL *)&local_f8);
                if (uVar4 == 0) {
                  dVar21 = (double)CONCAT44(uStack_94,local_98) * local_e8 +
                           (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                           (double)CONCAT44(local_f8._4_4_,(int)local_f8) +
                           (double)CONCAT44(iStack_9c,local_a0) * local_f0;
                  if (dVar21 <= -dVar21) {
                    dVar21 = -dVar21;
                  }
                  local_108[lVar18] = dVar21;
                  pRVar5 = local_100->real;
                  lVar6 = 0;
                  do {
                    (&local_a8)[lVar6] =
                         *(double *)((long)pRVar5 + lVar6 * 8 + local_b8) -
                         pRVar5[iVar12 * 0xf + lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  pRVar5 = local_100->real;
                  lVar6 = 0;
                  do {
                    (&local_f8)[lVar6] =
                         *(double *)((long)pRVar5 + lVar6 * 8 + local_c0) -
                         pRVar5[iVar12 * 0xf + lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  uVar4 = ref_math_normalize((REF_DBL *)&local_a8);
                  if (uVar4 == 0) {
                    uVar4 = ref_math_normalize((REF_DBL *)&local_f8);
                    if (uVar4 == 0) {
                      dVar21 = (double)CONCAT44(uStack_94,local_98) * local_e8 +
                               (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                               (double)CONCAT44(local_f8._4_4_,(int)local_f8) +
                               (double)CONCAT44(iStack_9c,local_a0) * local_f0;
                      if (dVar21 <= -dVar21) {
                        dVar21 = -dVar21;
                      }
                      if (dVar21 <= local_108[lVar18]) {
                        dVar21 = local_108[lVar18];
                      }
                      local_108[lVar18] = dVar21;
                      pRVar5 = local_100->real;
                      lVar6 = 0;
                      do {
                        (&local_a8)[lVar6] =
                             pRVar5[iVar17 * 0xf + lVar6] -
                             *(double *)((long)pRVar5 + lVar6 * 8 + local_b8);
                        lVar6 = lVar6 + 1;
                      } while (lVar6 != 3);
                      pRVar5 = local_100->real;
                      lVar6 = 0;
                      do {
                        (&local_f8)[lVar6] =
                             pRVar5[iVar12 * 0xf + lVar6] - pRVar5[RVar1 * 0xf + lVar6];
                        lVar6 = lVar6 + 1;
                      } while (lVar6 != 3);
                      uVar4 = ref_math_normalize((REF_DBL *)&local_a8);
                      if (uVar4 == 0) {
                        uVar4 = ref_math_normalize((REF_DBL *)&local_f8);
                        if (uVar4 == 0) {
                          dVar21 = (double)CONCAT44(uStack_94,local_98) * local_e8 +
                                   (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                                   (double)CONCAT44(local_f8._4_4_,(int)local_f8) +
                                   (double)CONCAT44(iStack_9c,local_a0) * local_f0;
                          if (dVar21 <= -dVar21) {
                            dVar21 = -dVar21;
                          }
                          if (dVar21 <= local_108[lVar18]) {
                            dVar21 = local_108[lVar18];
                          }
                          local_108[lVar18] = dVar21;
                          pRVar5 = local_100->real;
                          lVar6 = 0;
                          do {
                            (&local_a8)[lVar6] =
                                 pRVar5[iVar17 * 0xf + lVar6] -
                                 *(double *)((long)pRVar5 + lVar6 * 8 + local_c0);
                            lVar6 = lVar6 + 1;
                          } while (lVar6 != 3);
                          pRVar5 = local_100->real;
                          lVar6 = 0;
                          do {
                            (&local_f8)[lVar6] =
                                 pRVar5[iVar12 * 0xf + lVar6] - pRVar5[iVar13 * 0xf + lVar6];
                            lVar6 = lVar6 + 1;
                          } while (lVar6 != 3);
                          uVar4 = ref_math_normalize((REF_DBL *)&local_a8);
                          if (uVar4 == 0) {
                            uVar4 = ref_math_normalize((REF_DBL *)&local_f8);
                            if (uVar4 == 0) {
                              dVar21 = (double)CONCAT44(uStack_94,local_98) * local_e8 +
                                       (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                                       (double)CONCAT44(local_f8._4_4_,(int)local_f8) +
                                       (double)CONCAT44(iStack_9c,local_a0) * local_f0;
                              if (dVar21 <= -dVar21) {
                                dVar21 = -dVar21;
                              }
                              if (dVar21 <= local_108[lVar18]) {
                                dVar21 = local_108[lVar18];
                              }
                              local_108[lVar18] = dVar21;
                              bVar20 = true;
                              pRVar19 = local_110;
                              goto LAB_0021dc76;
                            }
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x1a4,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e1");
                            local_118 = uVar4;
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x1a3,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e0");
                            local_118 = uVar4;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x19c,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e1");
                          local_118 = uVar4;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x19b,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e0");
                        local_118 = uVar4;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x194,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e1");
                      local_118 = uVar4;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x193,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e0");
                    local_118 = uVar4;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x18c,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e1");
                  local_118 = uVar4;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x18b,"ref_layer_quad_right_triangles",(ulong)uVar4,"norm e0");
                local_118 = uVar4;
              }
              bVar20 = false;
              pRVar19 = local_110;
              goto LAB_0021dc76;
            }
            uVar9 = 0x185;
            pcVar16 = "n3 not found";
          }
          bVar20 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 uVar9,"ref_layer_quad_right_triangles",pcVar16);
          local_118 = 1;
          pRVar19 = local_110;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x170,"ref_layer_quad_right_triangles",(ulong)uVar4,"tri with2");
        bVar20 = false;
        local_118 = uVar4;
      }
LAB_0021dc76:
      if (!bVar20) {
        return local_118;
      }
      lVar18 = lVar18 + 1;
      iVar13 = local_d8->n;
    } while (lVar18 < iVar13);
  }
  pRVar5 = local_108;
  uVar4 = ref_sort_heap_dbl(iVar13,local_108,local_c8);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x1a8,
           "ref_layer_quad_right_triangles",(ulong)uVar4,"sort dots");
    return uVar4;
  }
  ref_edge_00 = local_d8;
  if (0 < local_d8->n) {
    lVar18 = 0;
    do {
      iVar13 = local_c8[lVar18];
      bVar20 = true;
      if (pRVar5[iVar13] <= 0.1736 && pRVar5[iVar13] != 0.1736) {
        RVar1 = local_d8->e2n[(long)iVar13 * 2];
        iVar13 = local_d8->e2n[iVar13 * 2 + 1];
        uVar4 = ref_cell_list_with2(local_110,RVar1,iVar13,2,&local_d0,(REF_INT *)&local_f8);
        pRVar5 = local_108;
        pRVar19 = local_110;
        if (uVar4 == 0) {
          if (local_d0 == 2) {
            uVar11 = (ulong)local_110->node_per;
            if ((long)uVar11 < 1) {
              iVar17 = -1;
              bVar20 = true;
            }
            else {
              uVar7 = 0xffffffff;
              uVar14 = 0;
              iVar12 = -1;
              do {
                iVar17 = local_110->c2n[(long)local_110->size_per * (long)(int)local_f8 + uVar14];
                if (iVar17 != iVar13 && iVar17 != RVar1) {
                  uVar7 = uVar14 & 0xffffffff;
                  iVar12 = iVar17;
                }
                iVar17 = (int)uVar7;
                uVar14 = uVar14 + 1;
              } while (uVar11 != uVar14);
              bVar20 = iVar12 == -1;
            }
            if (bVar20) {
              uVar9 = 0x1c0;
              pcVar16 = "n2 not found";
            }
            else if (iVar17 == -1) {
              uVar9 = 0x1c1;
              pcVar16 = "tn not found";
            }
            else {
              if (local_110->node_per < 1) {
                iVar12 = -1;
              }
              else {
                iVar12 = -1;
                uVar7 = 0;
                do {
                  iVar8 = local_110->c2n[(long)local_110->size_per * (long)local_f8._4_4_ + uVar7];
                  iVar15 = iVar8;
                  if (iVar8 == iVar13) {
                    iVar15 = iVar12;
                  }
                  if (iVar8 != RVar1) {
                    iVar12 = iVar15;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar11 != uVar7);
              }
              if (iVar12 != -1) {
                iVar13 = (uint)(iVar17 < 1) * 3;
                iVar8 = iVar13 + iVar17 + -1;
                pRVar3 = local_110->c2n;
                iVar15 = local_110->size_per * (int)local_f8;
                local_a8._0_4_ = pRVar3[iVar13 + iVar17 + iVar15 + -1];
                iVar17 = (uint)(iVar8 < 2) * 3;
                iVar13 = iVar15 + -2 + iVar17 + iVar8;
                local_a8._4_4_ = pRVar3[iVar13];
                local_a0 = pRVar3[(int)((uint)(iVar8 + iVar17 + -2 < 2) * 3 + iVar13 + -2)];
                local_98 = pRVar3[(long)local_110->size_per * (long)(int)local_f8 + 3];
                iStack_9c = iVar12;
                uVar4 = ref_cell_add(local_b0->cell[6],(REF_INT *)&local_a8,&local_114);
                if (uVar4 == 0) {
                  uVar4 = ref_cell_remove(pRVar19,(int)local_f8);
                  if (uVar4 == 0) {
                    uVar4 = ref_cell_remove(pRVar19,local_f8._4_4_);
                    pRVar5 = local_108;
                    bVar20 = uVar4 == 0;
                    if (!bVar20) {
                      bVar20 = false;
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x1d9,"ref_layer_quad_right_triangles",(ulong)uVar4,"remove tri 1");
                      local_118 = uVar4;
                    }
                    goto LAB_0021e11e;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x1d8,"ref_layer_quad_right_triangles",(ulong)uVar4,"remove tri 0");
                  local_118 = uVar4;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x1d7,"ref_layer_quad_right_triangles",(ulong)uVar4,"add");
                  local_118 = uVar4;
                }
                goto LAB_0021de4d;
              }
              uVar9 = 0x1ca;
              pcVar16 = "n3 not found";
            }
            bVar20 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,uVar9,"ref_layer_quad_right_triangles",pcVar16);
            local_118 = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x1b2,"ref_layer_quad_right_triangles",(ulong)uVar4,"tri with2");
          local_118 = uVar4;
LAB_0021de4d:
          bVar20 = false;
          pRVar5 = local_108;
        }
      }
LAB_0021e11e:
      if (!bVar20) {
        return local_118;
      }
      lVar18 = lVar18 + 1;
      ref_edge_00 = local_d8;
    } while (lVar18 < local_d8->n);
  }
  free(local_c8);
  if (pRVar5 != (REF_DBL *)0x0) {
    free(pRVar5);
  }
  uVar4 = ref_edge_free(ref_edge_00);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar16 = "free edge";
  uVar9 = 0x1df;
LAB_0021d503:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar9,
         "ref_layer_quad_right_triangles",(ulong)uVar4,pcVar16);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *dots;
  REF_INT edge, *order, o;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  ref_malloc_init(dots, ref_edge_n(ref_edge), REF_DBL, 2.0);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    n0 = ref_edge_e2n(ref_edge, 0, edge);
    n1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
    if (2 == ntri) {
      REF_INT t, cell_node, n2, n3, i;
      REF_DBL e0[3], e1[3];
      t = tri_list[0];
      n2 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n2 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n2, "n2 not found");
      t = tri_list[1];
      n3 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n3 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n3, "n3 not found");
      /* n2 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n2);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n2);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = ABS(ref_math_dot(e0, e1));
      /* n3 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n3);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n3);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n0 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n0);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n0);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n1 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n1);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n1);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
    }
  }
  RSS(ref_sort_heap_dbl(ref_edge_n(ref_edge), dots, order), "sort dots");

  for (o = 0; o < ref_edge_n(ref_edge); o++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    edge = order[o];
    if (dots[edge] < 0.1736) { /* sin(10 degrees) */
      n0 = ref_edge_e2n(ref_edge, 0, edge);
      n1 = ref_edge_e2n(ref_edge, 1, edge);

      RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
      if (2 == ntri) {
        REF_INT t, cell_node, n2, n3, tn, new_cell;
        REF_INT nodes[REF_CELL_MAX_NODE_PER];
        t = tri_list[0];
        n2 = REF_EMPTY;
        tn = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n2 = ref_cell_c2n(tri, cell_node, t);
            tn = cell_node;
          }
        }
        RAS(REF_EMPTY != n2, "n2 not found");
        RAS(REF_EMPTY != tn, "tn not found")
        t = tri_list[1];
        n3 = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n3 = ref_cell_c2n(tri, cell_node, t);
          }
        }
        RAS(REF_EMPTY != n3, "n3 not found");
        tn--;
        if (tn < 0) tn += 3;
        t = tri_list[0];
        nodes[0] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[1] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[2] = ref_cell_c2n(tri, tn, t);
        nodes[3] = n3;
        nodes[4] = ref_cell_c2n(tri, 3, t);
        RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell), "add");
        RSS(ref_cell_remove(tri, tri_list[0]), "remove tri 0");
        RSS(ref_cell_remove(tri, tri_list[1]), "remove tri 1");
      }
    }
  }
  ref_free(order);
  ref_free(dots);
  RSS(ref_edge_free(ref_edge), "free edge");
  return REF_SUCCESS;
}